

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * __thiscall
Catch::Detail::stringify<C_A_T_C_H_T_E_S_T_0()::base_const*>
          (string *__return_storage_ptr__,Detail *this,base **e)

{
  base **e_local;
  
  StringMaker<C_A_T_C_H_T_E_S_T_0()::base_const*,void>::convert<C_A_T_C_H_T_E_S_T_0()::base_const>
            (__return_storage_ptr__,*(StringMaker<C_A_T_C_H_T_E_S_T_0()::base_const*,void> **)this,
             (base *)e);
  return __return_storage_ptr__;
}

Assistant:

std::string stringify(const T& e) {
            return ::Catch::StringMaker<typename std::remove_cv<typename std::remove_reference<T>::type>::type>::convert(e);
        }